

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'\''>,_toml::detail::exactly<3UL>_>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  const_iterator f;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_100;
  region local_b0;
  region local_68;
  
  f._M_current = (loc->iter_)._M_current;
  if (f._M_current ==
      (((loc->source_).
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'\''>,_toml::detail::exactly<3UL>_>_>
    ::invoke(&local_100,loc);
    if (local_100.is_ok_ == true) {
      location::reset(loc,f);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      location::reset(loc,(const_iterator)(f._M_current + 1));
      region::region(&local_b0,loc,(const_iterator)f._M_current,
                     (const_iterator)(loc->iter_)._M_current);
      region::region(&local_68,&local_b0);
      f._M_current = (char *)&local_68;
      result<toml::detail::region,_toml::detail::none_t>::result
                (__return_storage_ptr__,(success_type *)&local_68);
      region::~region(&local_68);
      region::~region(&local_b0);
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup
              (&local_100,(EVP_PKEY_CTX *)f._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        auto first = loc.iter();

        auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            loc.reset(first);
            return none();
        }
        loc.reset(std::next(first)); // XXX maybe loc.advance() is okay but...
        return ok(region(loc, first, loc.iter()));
    }